

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void object_delete(chunk *c,chunk *p_c,object **obj_address)

{
  bitflag *pbVar1;
  object *obj;
  object *poVar2;
  object *poVar3;
  player_upkeep *ppVar4;
  object **ppoVar5;
  ulong uVar6;
  loc lVar7;
  
  obj = *obj_address;
  poVar2 = obj->prev;
  poVar3 = obj->next;
  if (poVar3 == (object *)0x0) {
    if (poVar2 != (object *)0x0) {
      poVar2->next = (object *)0x0;
    }
  }
  else if (poVar2 == (object *)0x0) {
    poVar3->prev = (object *)0x0;
  }
  else {
    poVar2->next = poVar3;
    poVar3->prev = poVar2;
  }
  if (((player != (player *)0x0) && (ppVar4 = player->upkeep, ppVar4 != (player_upkeep *)0x0)) &&
     (obj == ppVar4->object)) {
    ppVar4->object = (object *)0x0;
  }
  if (((p_c == (chunk *)0x0 || c == (chunk *)0x0) || (uVar6 = (ulong)obj->oidx, uVar6 == 0)) ||
     ((obj != c->objects[uVar6] || (p_c->objects[uVar6] == (object *)0x0)))) {
    if (((p_c != (chunk *)0x0) && (ppoVar5 = p_c->objects, ppoVar5 != (object **)0x0)) &&
       ((uVar6 = (ulong)obj->oidx, uVar6 != 0 && (obj == ppoVar5[uVar6])))) {
      ppoVar5[uVar6] = (object *)0x0;
    }
    if ((((c != (chunk *)0x0) && (ppoVar5 = c->objects, ppoVar5 != (object **)0x0)) &&
        (uVar6 = (ulong)obj->oidx, uVar6 != 0)) && (obj == ppoVar5[uVar6])) {
      ppoVar5[uVar6] = (object *)0x0;
    }
    object_free(obj);
    *obj_address = (object *)0x0;
  }
  else {
    lVar7 = (loc)loc(0,0);
    obj->grid = lVar7;
    obj->held_m_idx = 0;
    obj->mimicking_m_idx = 0;
    obj->prev = (object *)0x0;
    obj->next = (object *)0x0;
    pbVar1 = &obj->known->notice;
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

void object_delete(struct chunk *c, struct chunk *p_c,
				   struct object **obj_address)
{
	struct object *obj = *obj_address;
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	/* Check any next and previous objects */
	if (next) {
		if (prev) {
			prev->next = next;
			next->prev = prev;
		} else {
			next->prev = NULL;
		}
	} else if (prev) {
		prev->next = NULL;
	}

	/* If we're tracking the object, stop */
	if (player && player->upkeep && obj == player->upkeep->object)
		player->upkeep->object = NULL;

	/* Orphan rather than actually delete if we still have a known object */
	if (c && p_c && obj->oidx && (obj == c->objects[obj->oidx]) &&
		p_c->objects[obj->oidx]) {
		obj->grid = loc(0, 0);
		obj->prev = NULL;
		obj->next = NULL;
		obj->held_m_idx = 0;
		obj->mimicking_m_idx = 0;

		/* Object is now purely imaginary to the player */
		obj->known->notice |= OBJ_NOTICE_IMAGINED;

		return;
	}

	/* Remove from any lists */
	if (p_c && p_c->objects && obj->oidx && (obj == p_c->objects[obj->oidx]))
		p_c->objects[obj->oidx] = NULL;

	if (c && c->objects && obj->oidx && (obj == c->objects[obj->oidx]))
		c->objects[obj->oidx] = NULL;

	object_free(obj);
	*obj_address = NULL;
}